

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

ostream * Gudhi::operator<<(ostream *os,Simplex_tree<Gudhi::Simplex_tree_options_default> *st)

{
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
  *ppVar1;
  Siblings *pSVar2;
  Vertex_handle VVar3;
  Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
  *pSVar4;
  ostream *poVar5;
  Simplex_tree<Gudhi::Simplex_tree_options_default> *pSVar6;
  int iVar7;
  pointer pvVar8;
  anon_class_1_0_00000001 local_71;
  Simplex_tree<Gudhi::Simplex_tree_options_default> *local_70;
  pointer local_68;
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
  *local_60;
  Simplex_handle local_58;
  Simplex_vertex_range local_50;
  
  pvVar8 = (st->filtration_vect_).
           super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_68 = (st->filtration_vect_).
             super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_70 = st;
  if (pvVar8 == local_68) {
    local_50.
    super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
    .m_Begin.sib_ = (Siblings *)st;
    Simplex_tree<Gudhi::Simplex_tree_options_default>::
    initialize_filtration<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::is_before_in_totally_ordered_filtration,Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::initialize_filtration(bool)const::_lambda(boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>)_2_>
              (st,(is_before_in_totally_ordered_filtration *)&local_50,&local_71);
    pvVar8 = (st->filtration_vect_).
             super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_68 = (st->filtration_vect_).
               super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pvVar8 != local_68) {
    do {
      ppVar1 = pvVar8->m_ptr;
      pSVar4 = (ppVar1->second).children_;
      if ((pSVar4->parent_ == ppVar1->first) &&
         (pSVar4 = pSVar4->oncles_, pSVar4 == (Siblings *)0x0)) {
        iVar7 = -1;
      }
      else {
        iVar7 = -1;
        do {
          iVar7 = iVar7 + 1;
          pSVar4 = pSVar4->oncles_;
        } while (pSVar4 != (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
                            *)0x0);
      }
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)os,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_60 = ppVar1;
      local_58.m_ptr = ppVar1;
      Simplex_tree<Gudhi::Simplex_tree_options_default>::simplex_vertex_range
                (&local_50,local_70,&local_58);
      VVar3 = local_50.
              super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
              .m_End.v_;
      pSVar2 = local_50.
               super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
               .m_End.sib_;
      pSVar6 = (Simplex_tree<Gudhi::Simplex_tree_options_default> *)
               local_50.
               super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
               .m_Begin.sib_;
      iVar7 = local_50.
              super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
              .m_Begin.v_;
      if (local_50.
          super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
          .m_Begin.v_ !=
          local_50.
          super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
          .m_End.v_ ||
          local_50.
          super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
          .m_Begin.sib_ !=
          local_50.
          super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
          .m_End.sib_) {
        do {
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)os,iVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          iVar7 = (int)(pSVar6->nodes_label_to_list_)._M_h._M_bucket_count;
          pSVar6 = (Simplex_tree<Gudhi::Simplex_tree_options_default> *)
                   (pSVar6->nodes_label_to_list_)._M_h._M_buckets;
        } while (iVar7 != VVar3 ||
                 pSVar6 != (Simplex_tree<Gudhi::Simplex_tree_options_default> *)pSVar2);
      }
      poVar5 = std::ostream::_M_insert<double>
                         ((local_60->second).super_Filtration_simplex_base.filt_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      pvVar8 = pvVar8 + 1;
    } while (pvVar8 != local_68);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream & os, const Simplex_tree<T...> & st) {
  for (auto sh : st.filtration_simplex_range()) {
    os << st.dimension(sh) << " ";
    for (auto v : st.simplex_vertex_range(sh)) {
      os << v << " ";
    }
    os << st.filtration(sh) << "\n";  // TODO(VR): why adding the key ?? not read ?? << "     " << st.key(sh) << " \n";
  }
  return os;
}